

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPCEncoder.h
# Opt level: O3

int32_t __thiscall gnilk::IPCBinaryEncoder::WriteStr(IPCBinaryEncoder *this,string *value)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (**(code **)(*(long *)this + 0x60))(this,(short)value->_M_string_length);
  iVar2 = (*(code *)**(undefined8 **)this)(this,(value->_M_dataplus)._M_p,value->_M_string_length);
  return iVar2 + iVar1;
}

Assistant:

__inline int32_t WriteStr(const std::string &value) override {
            auto ret = WriteU16(value.size());
            ret += Write(value.data(), value.size());
            return ret;
        }